

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<bool,iutest::TestFlag::Fragment<8192>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,bool *expected,Fragment<8192> *actual)

{
  TestFlag *pTVar1;
  char cVar2;
  char *pcVar3;
  string local_68;
  string local_48;
  Fragment<8192> *pFVar4;
  
  pcVar3 = actual_str;
  pTVar1 = TestFlag::GetInstance();
  cVar2 = *actual_str - (((uint)pTVar1->m_test_flags >> 0xd & 1) != 0);
  pFVar4 = (Fragment<8192> *)CONCAT71((int7)((ulong)pcVar3 >> 8),cVar2);
  if (cVar2 == '\0') {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    FormatForComparisonFailureMessage<bool,iutest::TestFlag::Fragment<8192>>
              (&local_48,(internal *)actual_str,expected,pFVar4);
    FormatForComparisonFailureMessage<iutest::TestFlag::Fragment<8192>,bool>
              (&local_68,(internal *)expected,(Fragment<8192> *)actual_str,(bool *)pFVar4);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }